

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPath.c
# Opt level: O2

char * sbfPath_root(void)

{
  if (sbfPath_root::path != (char *)0x0) {
    return sbfPath_root::path;
  }
  sbfPath_root::path = getenv("SBF_PATH");
  if ((sbfPath_root::path == (char *)0x0) || (*sbfPath_root::path == '\0')) {
    sbfPath_root::path = ".";
  }
  return sbfPath_root::path;
}

Assistant:

const char*
sbfPath_root (void)
{
    static const char* path;

    if (path == NULL)
    {
        path = getenv ("SBF_PATH");
        if (path == NULL || *path == '\0')
            path = ".";
    }
    return path;
}